

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateCommandResult
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,bool raii)

{
  pointer pbVar1;
  pointer pbVar2;
  
  pbVar1 = (commandData->successCodes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (commandData->successCodes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 != pbVar2) {
    if ((long)pbVar2 - (long)pbVar1 == 0x20) {
      generateCommandResultSingleSuccess
                (__return_storage_ptr__,this,name,commandData,initialSkipCount,definition,raii);
    }
    else if ((commandData->errorCodes).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (commandData->errorCodes).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
      generateCommandResultMultiSuccessNoErrors
                (__return_storage_ptr__,this,name,commandData,initialSkipCount,definition,raii);
    }
    else {
      generateCommandResultMultiSuccessWithErrors
                (__return_storage_ptr__,this,name,commandData,initialSkipCount,definition,raii);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("!commandData.successCodes.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0xe07,
                "std::string VulkanHppGenerator::generateCommandResult(const std::string &, const CommandData &, size_t, bool, bool) const"
               );
}

Assistant:

std::string VulkanHppGenerator::generateCommandResult(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, bool raii ) const
{
  assert( !commandData.successCodes.empty() );
  if ( commandData.successCodes.size() == 1 )
  {
    return generateCommandResultSingleSuccess( name, commandData, initialSkipCount, definition, raii );
  }
  else if ( commandData.errorCodes.empty() )
  {
    return generateCommandResultMultiSuccessNoErrors( name, commandData, initialSkipCount, definition, raii );
  }
  else
  {
    return generateCommandResultMultiSuccessWithErrors( name, commandData, initialSkipCount, definition, raii );
  }
}